

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Utilities.h
# Opt level: O0

void __thiscall
soul::heart::Utilities::
GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
::throwCycleError(GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>
                  *this,ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>
                        stack,Context *errorContext)

{
  pointer this_00;
  reference __x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  allocator<char> local_111;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_110;
  string local_f0;
  CompileMessage local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  string local_78;
  Node **local_58;
  Node **node;
  Node **__end0;
  Node **__begin0;
  ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nodesInCycle;
  Context *errorContext_local;
  ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>
  stack_local;
  
  nodesInCycle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)stack.e;
  stack_local.s = stack.s;
  errorContext_local = (Context *)this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range3);
  __begin0 = (Node **)&errorContext_local;
  __end0 = ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>
           ::begin((ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>
                    *)__begin0);
  node = ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>
         ::end((ArrayView<const_soul::heart::Utilities::GraphTraversalHelper<CycleDetector,_soul::AST::ProcessorInstance,_soul::AST::Connection,_soul::AST::Context>::Node_*>
                *)__begin0);
  for (; __end0 != node; __end0 = __end0 + 1) {
    local_58 = __end0;
    SanityCheckPass::PostResolutionChecks::visit(soul::AST::Graph&)::CycleDetector::
    getProcessorName[abi:cxx11](soul::AST::ProcessorInstance_const__(&local_78,(*__end0)->processor)
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  __x = std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::front((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range3,__x);
  local_90._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3);
  local_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range3);
  std::
  reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (local_90,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )local_98);
  this_00 = nodesInCycle.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110," -> ",&local_111);
  joinStrings<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_f0,(soul *)&__range3,&local_110,(string *)errorContext);
  Errors::feedbackInGraph<std::__cxx11::string>(&local_d0,(Errors *)&local_f0,args);
  AST::Context::throwError((Context *)this_00,&local_d0,false);
}

Assistant:

static void throwCycleError (ArrayView<const Node*> stack, const ContextType& errorContext)
        {
            std::vector<std::string> nodesInCycle;

            for (auto& node : stack)
                nodesInCycle.push_back (Subclass::getProcessorName (node->processor));

            nodesInCycle.push_back (nodesInCycle.front());
            std::reverse (nodesInCycle.begin(), nodesInCycle.end());

            errorContext.throwError (Errors::feedbackInGraph (joinStrings (nodesInCycle, " -> ")));
        }